

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  uchar *puVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  
  sVar1 = mbedtls_mpi_size(X);
  if (buflen < sVar1) {
    iVar5 = -8;
  }
  else {
    iVar5 = 0;
    memset(buf,0,buflen);
    puVar2 = buf + buflen;
    bVar3 = 0;
    for (uVar4 = 0; puVar2 = puVar2 + -1, sVar1 != uVar4; uVar4 = uVar4 + 1) {
      *puVar2 = (uchar)(*(ulong *)((long)X->p + (uVar4 & 0xfffffffffffffff8)) >> (bVar3 & 0x38));
      bVar3 = bVar3 + 8;
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X, unsigned char *buf, size_t buflen )
{
    size_t i, j, n;

    n = mbedtls_mpi_size( X );

    if( buflen < n )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    memset( buf, 0, buflen );

    for( i = buflen - 1, j = 0; n > 0; i--, j++, n-- )
        buf[i] = (unsigned char)( X->p[j / ciL] >> ((j % ciL) << 3) );

    return( 0 );
}